

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3VdbeSorterClose(sqlite3 *db,VdbeCursor *pCsr)

{
  sqlite3 *in_RSI;
  VdbeSorter *in_RDI;
  VdbeSorter *pSorter;
  void *p;
  
  p = *(void **)&in_RSI->nDb;
  if (p != (void *)0x0) {
    sqlite3VdbeSorterReset((sqlite3 *)pSorter,in_RDI);
    sqlite3_free((void *)0x1718fb);
    sqlite3DbFree(in_RSI,p);
    in_RSI->nDb = 0;
    in_RSI->mDbFlags = 0;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VdbeSorterClose(sqlite3 *db, VdbeCursor *pCsr){
  VdbeSorter *pSorter;
  assert( pCsr->eCurType==CURTYPE_SORTER );
  pSorter = pCsr->uc.pSorter;
  if( pSorter ){
    sqlite3VdbeSorterReset(db, pSorter);
    sqlite3_free(pSorter->list.aMemory);
    sqlite3DbFree(db, pSorter);
    pCsr->uc.pSorter = 0;
  }
}